

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::io::anon_unknown_0::BlockSizes_ReadStringReservesMemoryOnPushedLimit_Test::
BlockSizes_ReadStringReservesMemoryOnPushedLimit_Test
          (BlockSizes_ReadStringReservesMemoryOnPushedLimit_Test *this)

{
  BlockSizes_ReadStringReservesMemoryOnPushedLimit_Test *this_local;
  
  BlockSizes::BlockSizes(&this->super_BlockSizes);
  (this->super_BlockSizes).super_CodedStreamTest.super_Test._vptr_Test =
       (_func_int **)&PTR__BlockSizes_ReadStringReservesMemoryOnPushedLimit_Test_02a16b00;
  (this->super_BlockSizes).super_WithParamInterface<int>._vptr_WithParamInterface =
       (_func_int **)&DAT_02a16b40;
  return;
}

Assistant:

TEST_P(BlockSizes, ReadStringReservesMemoryOnPushedLimit) {
  int kBlockSizes_case = GetParam();
  memcpy(buffer_, kRawBytes, sizeof(kRawBytes));
  ArrayInputStream input(buffer_, sizeof(buffer_), kBlockSizes_case);

  {
    CodedInputStream coded_input(&input);
    coded_input.PushLimit(sizeof(buffer_));

    std::string str;
    EXPECT_TRUE(coded_input.ReadString(&str, strlen(kRawBytes)));
    EXPECT_EQ(kRawBytes, str);
    // TODO: Replace with a more meaningful test (see cl/60966023).
    EXPECT_GE(str.capacity(), strlen(kRawBytes));
  }

  EXPECT_EQ(strlen(kRawBytes), input.ByteCount());
}